

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xml_allocator::deallocate_memory
          (xml_allocator *this,void *ptr,size_t size,xml_memory_page *page)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (this->_root == (xml_memory_page *)size) {
    sVar2 = this->_busy_size;
    *(size_t *)(size + 0x18) = sVar2;
  }
  else {
    sVar2 = *(size_t *)(size + 0x18);
  }
  sVar3 = (long)ptr + *(long *)(size + 0x20);
  *(size_t *)(size + 0x20) = sVar3;
  if (sVar3 == sVar2) {
    if (*(long *)(size + 0x10) != 0) {
      lVar1 = *(long *)(size + 8);
      *(long *)(lVar1 + 0x10) = *(long *)(size + 0x10);
      *(long *)(*(long *)(size + 0x10) + 8) = lVar1;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (size);
      return;
    }
    *(undefined8 *)(size + 0x18) = 0;
    *(undefined8 *)(size + 0x20) = 0;
    this->_busy_size = 0;
  }
  return;
}

Assistant:

void deallocate_memory(void* ptr, size_t size, xml_memory_page* page)
		{
			if (page == _root) page->busy_size = _busy_size;

			assert(ptr >= reinterpret_cast<char*>(page) + sizeof(xml_memory_page) && ptr < reinterpret_cast<char*>(page) + sizeof(xml_memory_page) + page->busy_size);
			(void)!ptr;

			page->freed_size += size;
			assert(page->freed_size <= page->busy_size);

			if (page->freed_size == page->busy_size)
			{
				if (page->next == NULL)
				{
					assert(_root == page);

					// top page freed, just reset sizes
					page->busy_size = 0;
					page->freed_size = 0;

				#ifdef PUGIXML_COMPACT
					// reset compact state to maximize efficiency
					page->compact_string_base = NULL;
					page->compact_shared_parent = NULL;
					page->compact_page_marker = NULL;
				#endif

					_busy_size = 0;
				}
				else
				{
					assert(_root != page);
					assert(page->prev);

					// remove from the list
					page->prev->next = page->next;
					page->next->prev = page->prev;

					// deallocate
					deallocate_page(page);
				}
			}
		}